

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Index __thiscall wabt::Module::GetFuncTypeIndex(Module *this,FuncSignature *sig)

{
  pointer ppTVar1;
  TypeEntry *pTVar2;
  bool bVar3;
  bool bVar4;
  ulong unaff_RBP;
  long lVar5;
  ulong uVar6;
  
  ppTVar1 = (this->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->types).
                super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppTVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    uVar6 = 0;
    do {
      pTVar2 = ppTVar1[uVar6];
      bVar4 = true;
      if ((pTVar2 != (TypeEntry *)0x0) && (pTVar2->kind_ == Func)) {
        bVar3 = FuncSignature::operator==((FuncSignature *)(pTVar2 + 1),sig);
        bVar4 = !bVar3;
        unaff_RBP = unaff_RBP & 0xffffffff;
        if (bVar3) {
          unaff_RBP = uVar6 & 0xffffffff;
        }
      }
      if (!bVar4) {
        return (Index)unaff_RBP;
      }
      uVar6 = uVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != uVar6);
  }
  return 0xffffffff;
}

Assistant:

Index Module::GetFuncTypeIndex(const FuncSignature& sig) const {
  for (size_t i = 0; i < types.size(); ++i) {
    if (auto* func_type = dyn_cast<FuncType>(types[i])) {
      if (func_type->sig == sig) {
        return i;
      }
    }
  }
  return kInvalidIndex;
}